

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

string * __thiscall
pegmatite::InputRange::str_abi_cxx11_(string *__return_storage_ptr__,InputRange *this)

{
  Input *this_00;
  Index IVar1;
  bool bVar2;
  string *psVar3;
  char32_t cVar4;
  ulong uVar5;
  Index n;
  stringstream s;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = (this->start).it.buffer;
  n = (this->start).it.idx;
  IVar1 = (this->finish).it.idx;
  uVar5 = (ulong)(this->finish).it.buffer ^ (ulong)this_00;
  if (n != IVar1 || uVar5 != 0) {
    do {
      if ((n < this_00->buffer_start) || (this_00->buffer_end <= n)) {
        cVar4 = Input::slowCharacterLookup(this_00,n);
        local_1c1 = (char)cVar4;
      }
      else {
        local_1c1 = (char)this_00->buffer[n - this_00->buffer_start];
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c1,1);
      bVar2 = IVar1 - 1 != n;
      n = n + 1;
    } while (bVar2 || uVar5 != 0);
  }
  psVar3 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string InputRange::str() const
{
	std::stringstream s;

	for (char32_t c : *this)
	{
		s << static_cast<char>(c);
	}

	return s.str();
}